

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O3

void __thiscall asmjit::Assembler::sync(Assembler *this)

{
  SectionEntry *pSVar1;
  ulong uVar2;
  
  if ((this->super_CodeEmitter)._code == (CodeHolder *)0x0) {
    sync();
  }
  else {
    pSVar1 = this->_section;
    if (pSVar1 != (SectionEntry *)0x0) {
      if (this->_bufferData == (pSVar1->_buffer)._data) {
        uVar2 = (long)this->_bufferPtr - (long)this->_bufferData;
        if ((pSVar1->_buffer)._length < uVar2) {
          (pSVar1->_buffer)._length = uVar2;
        }
        return;
      }
      goto LAB_0015da6e;
    }
  }
  sync();
LAB_0015da6e:
  sync();
}

Assistant:

void Assembler::sync() noexcept {
  ASMJIT_ASSERT(_code != nullptr);                       // Only called by CodeHolder, so we must be attached.
  ASMJIT_ASSERT(_section != nullptr);                    // One section must always be active, no matter what.
  ASMJIT_ASSERT(_bufferData == _section->_buffer._data); // `_bufferStart` is a shortcut to `_section->buffer.data`.

  // Update only if the current offset is greater than the section length.
  size_t offset = (size_t)(_bufferPtr - _bufferData);
  if (_section->getBuffer().getLength() < offset)
    _section->_buffer._length = offset;
}